

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O3

int erkStep_ComputeSolutions(ARKodeMem ark_mem,realtype *dsmPtr)

{
  void *pvVar1;
  N_Vector z;
  N_Vector z_00;
  realtype *c;
  N_Vector *X;
  int iVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  realtype rVar7;
  
  pvVar1 = ark_mem->step_mem;
  if (pvVar1 == (void *)0x0) {
    iVar5 = -0x15;
    arkProcessError(ark_mem,-0x15,"ARKode::ERKStep","erkStep_ComputeSolutions",
                    "Time step module memory is NULL.");
  }
  else {
    z = ark_mem->ycur;
    z_00 = ark_mem->tempv1;
    c = *(realtype **)((long)pvVar1 + 0x30);
    X = *(N_Vector **)((long)pvVar1 + 0x38);
    *dsmPtr = 0.0;
    uVar6 = (ulong)*(int *)((long)pvVar1 + 0x18);
    if ((long)uVar6 < 1) {
      uVar6 = 0;
    }
    else {
      uVar3 = 0;
      do {
        c[uVar3] = ark_mem->h *
                   *(double *)(*(long *)(*(long *)((long)pvVar1 + 0x20) + 0x20) + uVar3 * 8);
        X[uVar3] = *(N_Vector *)(*(long *)((long)pvVar1 + 8) + uVar3 * 8);
        uVar3 = uVar3 + 1;
      } while (uVar6 != uVar3);
    }
    c[uVar6 & 0xffffffff] = 1.0;
    X[uVar6 & 0xffffffff] = ark_mem->yn;
    iVar2 = N_VLinearCombination((int)uVar6 + 1,c,X,z);
    iVar5 = -0x1c;
    if ((iVar2 == 0) && (iVar5 = 0, ark_mem->fixedstep == 0)) {
      iVar5 = *(int *)((long)pvVar1 + 0x18);
      if ((long)iVar5 < 1) {
        iVar5 = 0;
      }
      else {
        lVar4 = 0;
        do {
          c[lVar4] = (*(double *)(*(long *)(*(long *)((long)pvVar1 + 0x20) + 0x20) + lVar4 * 8) -
                     *(double *)(*(long *)(*(long *)((long)pvVar1 + 0x20) + 0x28) + lVar4 * 8)) *
                     ark_mem->h;
          X[lVar4] = *(N_Vector *)(*(long *)((long)pvVar1 + 8) + lVar4 * 8);
          lVar4 = lVar4 + 1;
        } while (iVar5 != lVar4);
      }
      iVar2 = N_VLinearCombination(iVar5,c,X,z_00);
      iVar5 = -0x1c;
      if (iVar2 == 0) {
        rVar7 = N_VWrmsNorm(z_00,ark_mem->ewt);
        *dsmPtr = rVar7;
        iVar5 = 0;
      }
    }
  }
  return iVar5;
}

Assistant:

int erkStep_ComputeSolutions(ARKodeMem ark_mem, realtype *dsmPtr)
{
  /* local data */
  int retval, j, nvec;
  N_Vector y, yerr;
  realtype* cvals;
  N_Vector* Xvecs;
  ARKodeERKStepMem step_mem;

  /* access ARKodeERKStepMem structure */
  if (ark_mem->step_mem==NULL) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ERKStep",
                    "erkStep_ComputeSolutions", MSG_ERKSTEP_NO_MEM);
    return(ARK_MEM_NULL);
  }
  step_mem = (ARKodeERKStepMem) ark_mem->step_mem;

  /* set N_Vector shortcuts */
  y    = ark_mem->ycur;
  yerr = ark_mem->tempv1;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* initialize output */
  *dsmPtr = ZERO;


  /* Compute time step solution */
  /*   set arrays for fused vector operation */
  nvec = 0;
  for (j=0; j<step_mem->stages; j++) {
    cvals[nvec] = ark_mem->h * step_mem->B->b[j];
    Xvecs[nvec] = step_mem->F[j];
    nvec += 1;
  }
  cvals[nvec] = ONE;
  Xvecs[nvec] = ark_mem->yn;
  nvec += 1;

  /*   call fused vector operation to do the work */
  retval = N_VLinearCombination(nvec, cvals, Xvecs, y);
  if (retval != 0) return(ARK_VECTOROP_ERR);

  /* Compute yerr (if step adaptivity enabled) */
  if (!ark_mem->fixedstep) {

    /* set arrays for fused vector operation */
    nvec = 0;
    for (j=0; j<step_mem->stages; j++) {
      cvals[nvec] = ark_mem->h * (step_mem->B->b[j] - step_mem->B->d[j]);
      Xvecs[nvec] = step_mem->F[j];
      nvec += 1;
    }

    /* call fused vector operation to do the work */
    retval = N_VLinearCombination(nvec, cvals, Xvecs, yerr);
    if (retval != 0) return(ARK_VECTOROP_ERR);

    /* fill error norm */
    *dsmPtr = N_VWrmsNorm(yerr, ark_mem->ewt);
  }

  return(ARK_SUCCESS);
}